

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O2

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> __thiscall
flatbuffers::NewLuaBfbsGenerator(flatbuffers *this,string *flatc_version)

{
  undefined8 *puVar1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_498;
  allocator<char> local_497;
  allocator<char> local_496;
  allocator<char> local_495;
  allocator<char> local_494;
  allocator<char> local_493;
  allocator<char> local_492;
  allocator_type local_491;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_490;
  allocator<char> local_48f;
  allocator<char> local_48e;
  allocator<char> local_48d;
  allocator<char> local_48c;
  allocator<char> local_48b;
  allocator<char> local_48a;
  allocator<char> local_489;
  allocator<char> local_488;
  allocator<char> local_487;
  allocator<char> local_486;
  allocator<char> local_485;
  allocator<char> local_484;
  allocator<char> local_483;
  allocator<char> local_482;
  allocator<char> local_481;
  string *local_480;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  undefined1 local_448 [64];
  undefined8 local_408;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  undefined8 local_360;
  string local_358 [32];
  string local_338 [32];
  string local_318 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  puVar1 = (undefined8 *)operator_new(0x270);
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  puVar1[5] = 0;
  *puVar1 = &PTR__LuaBfbsGenerator_002fb968;
  puVar1[10] = 0;
  puVar1[6] = puVar1 + 0xc;
  puVar1[7] = 1;
  puVar1[8] = 0;
  puVar1[9] = 0;
  *(undefined4 *)(puVar1 + 10) = 0x3f800000;
  puVar1[0xf] = 0;
  puVar1[0xb] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[0xe] = 0;
  puVar1[0x10] = puVar1 + 0xe;
  puVar1[0x11] = puVar1 + 0xe;
  puVar1[0x12] = 0;
  puVar1[0x13] = puVar1 + 0x15;
  puVar1[0x14] = 0;
  *(undefined1 *)(puVar1 + 0x15) = 0;
  puVar1[0x17] = 0;
  puVar1[0x18] = 0;
  std::__cxx11::string::string((string *)(puVar1 + 0x19),(string *)flatc_version);
  local_448._0_4_ = kUpperCamel;
  local_448._4_4_ = kUnknown;
  local_448._8_4_ = kUpperCamel;
  local_448._12_4_ = kUpperCamel;
  local_448._16_4_ = kUpperCamel;
  local_448._20_4_ = kLowerCamel;
  local_448._24_4_ = kKeep;
  local_480 = (string *)(puVar1 + 0x19);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_448 + 0x20),"",(allocator<char> *)&local_2f0);
  local_408._0_4_ = AfterConvertingCase;
  local_408._4_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>(local_400,"__",(allocator<char> *)&local_478);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"",&local_492);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"",&local_493);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"",&local_494);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"_",&local_495);
  local_360._0_4_ = kKeep;
  local_360._4_4_ = kKeep;
  std::__cxx11::string::string<std::allocator<char>>(local_358,"",&local_496);
  std::__cxx11::string::string<std::allocator<char>>(local_338,"",&local_497);
  std::__cxx11::string::string<std::allocator<char>>(local_318,".lua",&local_498);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"and",&local_492);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"break",&local_493);
  std::__cxx11::string::string<std::allocator<char>>(local_2b0,"do",&local_494);
  std::__cxx11::string::string<std::allocator<char>>(local_290,"else",&local_495);
  std::__cxx11::string::string<std::allocator<char>>(local_270,"elseif",&local_496);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"end",&local_497);
  std::__cxx11::string::string<std::allocator<char>>(local_230,"false",&local_498);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"for",&local_481);
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"function",&local_482);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"goto",&local_483);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"if",&local_484);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"in",&local_485);
  std::__cxx11::string::string<std::allocator<char>>(local_170,"local",&local_486);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"nil",&local_487);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"not",&local_488);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"or",&local_489);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"repeat",&local_48a);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"return",&local_48b);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"then",&local_48c);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"true",&local_48d);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"until",&local_48e);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"while",&local_48f);
  __l._M_len = 0x16;
  __l._M_array = &local_2f0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_478,__l,&local_490,&local_491);
  lVar2 = 0x2a0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_2f0._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  BfbsNamer::BfbsNamer
            ((BfbsNamer *)(puVar1 + 0x1d),(Config *)local_448,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_478);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_478);
  Namer::Config::~Config((Config *)local_448);
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CodeGenerator> NewLuaBfbsGenerator(
    const std::string &flatc_version) {
  return std::unique_ptr<LuaBfbsGenerator>(new LuaBfbsGenerator(flatc_version));
}